

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_sse2.c
# Opt level: O0

void aom_fft_unpack_2d_output_sse2(float *packed,float *output,int n)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int in_EDX;
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  __m128 real2;
  __m128 real1;
  int c_2;
  int c_1;
  int r;
  int c;
  int n2;
  int local_298;
  int local_290;
  int local_248;
  int local_244;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  __m128 imag2_1;
  __m128 imag1_1;
  __m128 real2_1;
  __m128 real1_1;
  int c_4;
  int c_3;
  int r3;
  int r2;
  __m128 imag2;
  __m128 imag1;
  
  iVar9 = in_EDX / 2;
  *in_RSI = *in_RDI;
  in_RSI[1] = 0;
  in_RSI[iVar9 * in_EDX * 2] = in_RDI[iVar9 * in_EDX];
  in_RSI[iVar9 * in_EDX * 2 + 1] = 0;
  in_RSI[iVar9 << 1] = in_RDI[iVar9];
  in_RSI[iVar9 * 2 + 1] = 0;
  in_RSI[(iVar9 * in_EDX + iVar9) * 2] = in_RDI[iVar9 * in_EDX + iVar9];
  in_RSI[(iVar9 * in_EDX + iVar9) * 2 + 1] = 0;
  for (local_1e4 = 1; local_1e4 < iVar9; local_1e4 = local_1e4 + 1) {
    in_RSI[local_1e4 << 1] = in_RDI[local_1e4];
    in_RSI[local_1e4 * 2 + 1] = in_RDI[local_1e4 + iVar9];
    in_RSI[(iVar9 * in_EDX + local_1e4) * 2] = in_RDI[iVar9 * in_EDX + local_1e4];
    in_RSI[(iVar9 * in_EDX + local_1e4) * 2 + 1] = in_RDI[iVar9 * in_EDX + local_1e4 + iVar9];
  }
  for (local_1e8 = 1; local_1e8 < iVar9; local_1e8 = local_1e8 + 1) {
    in_RSI[local_1e8 * in_EDX * 2] = in_RDI[local_1e8 * in_EDX];
    in_RSI[local_1e8 * in_EDX * 2 + 1] = in_RDI[(local_1e8 + iVar9) * in_EDX];
    in_RSI[(local_1e8 * in_EDX + iVar9) * 2] = in_RDI[local_1e8 * in_EDX + iVar9];
    in_RSI[(local_1e8 * in_EDX + iVar9) * 2 + 1] = in_RDI[(local_1e8 + iVar9) * in_EDX + iVar9];
    local_1ec = 1;
    while( true ) {
      local_290 = iVar9;
      if (3 < iVar9) {
        local_290 = 4;
      }
      if (local_290 <= local_1ec) break;
      in_RSI[(local_1e8 * in_EDX + local_1ec) * 2] =
           (float)in_RDI[local_1e8 * in_EDX + local_1ec] -
           (float)in_RDI[(local_1e8 + iVar9) * in_EDX + local_1ec + iVar9];
      in_RSI[(local_1e8 * in_EDX + local_1ec) * 2 + 1] =
           (float)in_RDI[(local_1e8 + iVar9) * in_EDX + local_1ec] +
           (float)in_RDI[local_1e8 * in_EDX + local_1ec + iVar9];
      local_1ec = local_1ec + 1;
    }
    for (local_1f0 = 4; local_1f0 < iVar9; local_1f0 = local_1f0 + 4) {
      uVar1 = *(undefined8 *)(in_RDI + (long)(local_1e8 * in_EDX) + (long)local_1f0);
      uVar2 = *(undefined8 *)((long)(in_RDI + (long)(local_1e8 * in_EDX) + (long)local_1f0) + 8);
      uVar3 = *(undefined8 *)
               (in_RDI + (long)((local_1e8 + iVar9) * in_EDX) + (long)local_1f0 + (long)iVar9);
      uVar4 = *(undefined8 *)
               ((long)(in_RDI + (long)((local_1e8 + iVar9) * in_EDX) + (long)local_1f0 + (long)iVar9
                      ) + 8);
      uVar5 = *(undefined8 *)(in_RDI + (long)((local_1e8 + iVar9) * in_EDX) + (long)local_1f0);
      uVar6 = *(undefined8 *)
               ((long)(in_RDI + (long)((local_1e8 + iVar9) * in_EDX) + (long)local_1f0) + 8);
      uVar7 = *(undefined8 *)(in_RDI + (long)(local_1e8 * in_EDX) + (long)local_1f0 + (long)iVar9);
      uVar8 = *(undefined8 *)
               ((long)(in_RDI + (long)(local_1e8 * in_EDX) + (long)local_1f0 + (long)iVar9) + 8);
      local_158 = (float)uVar1;
      fStack_154 = (float)((ulong)uVar1 >> 0x20);
      fStack_150 = (float)uVar2;
      fStack_14c = (float)((ulong)uVar2 >> 0x20);
      local_168 = (float)uVar3;
      fStack_164 = (float)((ulong)uVar3 >> 0x20);
      fStack_160 = (float)uVar4;
      fStack_15c = (float)((ulong)uVar4 >> 0x20);
      local_118 = (float)uVar5;
      fStack_114 = (float)((ulong)uVar5 >> 0x20);
      fStack_110 = (float)uVar6;
      fStack_10c = (float)((ulong)uVar6 >> 0x20);
      local_128 = (float)uVar7;
      fStack_124 = (float)((ulong)uVar7 >> 0x20);
      fStack_120 = (float)uVar8;
      fStack_11c = (float)((ulong)uVar8 >> 0x20);
      *(ulong *)(in_RSI + (local_1e8 * in_EDX + local_1f0) * 2) =
           CONCAT44(local_118 + local_128,local_158 - local_168);
      *(ulong *)((long)(in_RSI + (local_1e8 * in_EDX + local_1f0) * 2) + 8) =
           CONCAT44(fStack_114 + fStack_124,fStack_154 - fStack_164);
      *(ulong *)(in_RSI + ((local_1e8 * in_EDX + local_1f0) * 2 + 4)) =
           CONCAT44(fStack_110 + fStack_120,fStack_150 - fStack_160);
      *(ulong *)((long)(in_RSI + ((local_1e8 * in_EDX + local_1f0) * 2 + 4)) + 8) =
           CONCAT44(fStack_10c + fStack_11c,fStack_14c - fStack_15c);
    }
    iVar10 = local_1e8 + iVar9;
    iVar11 = in_EDX - iVar10;
    in_RSI[iVar10 * in_EDX * 2] = in_RDI[iVar11 * in_EDX];
    in_RSI[iVar10 * in_EDX * 2 + 1] = in_RDI[(iVar11 + iVar9) * in_EDX] ^ 0x80000000;
    in_RSI[(iVar10 * in_EDX + iVar9) * 2] = in_RDI[iVar11 * in_EDX + iVar9];
    in_RSI[(iVar10 * in_EDX + iVar9) * 2 + 1] =
         in_RDI[(iVar11 + iVar9) * in_EDX + iVar9] ^ 0x80000000;
    local_244 = 1;
    while( true ) {
      local_298 = iVar9;
      if (4 < iVar9) {
        local_298 = 4;
      }
      if (local_298 <= local_244) break;
      in_RSI[(iVar10 * in_EDX + local_244) * 2] =
           (float)in_RDI[iVar11 * in_EDX + local_244] +
           (float)in_RDI[(iVar11 + iVar9) * in_EDX + local_244 + iVar9];
      in_RSI[(iVar10 * in_EDX + local_244) * 2 + 1] =
           -(float)in_RDI[(iVar11 + iVar9) * in_EDX + local_244] +
           (float)in_RDI[iVar11 * in_EDX + local_244 + iVar9];
      local_244 = local_244 + 1;
    }
    for (local_248 = 4; local_248 < iVar9; local_248 = local_248 + 4) {
      uVar1 = *(undefined8 *)(in_RDI + (long)(iVar11 * in_EDX) + (long)local_248);
      uVar2 = *(undefined8 *)((long)(in_RDI + (long)(iVar11 * in_EDX) + (long)local_248) + 8);
      uVar3 = *(undefined8 *)
               (in_RDI + (long)((iVar11 + iVar9) * in_EDX) + (long)local_248 + (long)iVar9);
      uVar4 = *(undefined8 *)
               ((long)(in_RDI + (long)((iVar11 + iVar9) * in_EDX) + (long)local_248 + (long)iVar9) +
               8);
      uVar5 = *(undefined8 *)(in_RDI + (long)((iVar11 + iVar9) * in_EDX) + (long)local_248);
      uVar6 = *(undefined8 *)
               ((long)(in_RDI + (long)((iVar11 + iVar9) * in_EDX) + (long)local_248) + 8);
      uVar7 = *(undefined8 *)(in_RDI + (long)(iVar11 * in_EDX) + (long)local_248 + (long)iVar9);
      uVar8 = *(undefined8 *)
               ((long)(in_RDI + (long)(iVar11 * in_EDX) + (long)local_248 + (long)iVar9) + 8);
      local_138 = (float)uVar1;
      fStack_134 = (float)((ulong)uVar1 >> 0x20);
      fStack_130 = (float)uVar2;
      fStack_12c = (float)((ulong)uVar2 >> 0x20);
      local_148 = (float)uVar3;
      fStack_144 = (float)((ulong)uVar3 >> 0x20);
      fStack_140 = (float)uVar4;
      fStack_13c = (float)((ulong)uVar4 >> 0x20);
      local_178 = (float)uVar7;
      fStack_174 = (float)((ulong)uVar7 >> 0x20);
      fStack_170 = (float)uVar8;
      fStack_16c = (float)((ulong)uVar8 >> 0x20);
      local_188 = (float)uVar5;
      fStack_184 = (float)((ulong)uVar5 >> 0x20);
      fStack_180 = (float)uVar6;
      fStack_17c = (float)((ulong)uVar6 >> 0x20);
      *(ulong *)(in_RSI + (iVar10 * in_EDX + local_248) * 2) =
           CONCAT44(local_178 - local_188,local_138 + local_148);
      *(ulong *)((long)(in_RSI + (iVar10 * in_EDX + local_248) * 2) + 8) =
           CONCAT44(fStack_174 - fStack_184,fStack_134 + fStack_144);
      *(ulong *)(in_RSI + ((iVar10 * in_EDX + local_248) * 2 + 4)) =
           CONCAT44(fStack_170 - fStack_180,fStack_130 + fStack_140);
      *(ulong *)((long)(in_RSI + ((iVar10 * in_EDX + local_248) * 2 + 4)) + 8) =
           CONCAT44(fStack_16c - fStack_17c,fStack_12c + fStack_13c);
    }
  }
  return;
}

Assistant:

void aom_fft_unpack_2d_output_sse2(const float *packed, float *output, int n) {
  const int n2 = n / 2;
  output[0] = packed[0];
  output[1] = 0;
  output[2 * (n2 * n)] = packed[n2 * n];
  output[2 * (n2 * n) + 1] = 0;

  output[2 * n2] = packed[n2];
  output[2 * n2 + 1] = 0;
  output[2 * (n2 * n + n2)] = packed[n2 * n + n2];
  output[2 * (n2 * n + n2) + 1] = 0;

  for (int c = 1; c < n2; ++c) {
    output[2 * (0 * n + c)] = packed[c];
    output[2 * (0 * n + c) + 1] = packed[c + n2];
    output[2 * (n2 * n + c) + 0] = packed[n2 * n + c];
    output[2 * (n2 * n + c) + 1] = packed[n2 * n + c + n2];
  }
  for (int r = 1; r < n2; ++r) {
    output[2 * (r * n + 0)] = packed[r * n];
    output[2 * (r * n + 0) + 1] = packed[(r + n2) * n];
    output[2 * (r * n + n2) + 0] = packed[r * n + n2];
    output[2 * (r * n + n2) + 1] = packed[(r + n2) * n + n2];

    for (int c = 1; c < AOMMIN(n2, 4); ++c) {
      output[2 * (r * n + c)] =
          packed[r * n + c] - packed[(r + n2) * n + c + n2];
      output[2 * (r * n + c) + 1] =
          packed[(r + n2) * n + c] + packed[r * n + c + n2];
    }

    for (int c = 4; c < n2; c += 4) {
      __m128 real1 = _mm_load_ps(packed + r * n + c);
      __m128 real2 = _mm_load_ps(packed + (r + n2) * n + c + n2);
      __m128 imag1 = _mm_load_ps(packed + (r + n2) * n + c);
      __m128 imag2 = _mm_load_ps(packed + r * n + c + n2);
      real1 = _mm_sub_ps(real1, real2);
      imag1 = _mm_add_ps(imag1, imag2);
      _mm_store_ps(output + 2 * (r * n + c), _mm_unpacklo_ps(real1, imag1));
      _mm_store_ps(output + 2 * (r * n + c + 2), _mm_unpackhi_ps(real1, imag1));
    }

    int r2 = r + n2;
    int r3 = n - r2;
    output[2 * (r2 * n + 0)] = packed[r3 * n];
    output[2 * (r2 * n + 0) + 1] = -packed[(r3 + n2) * n];
    output[2 * (r2 * n + n2)] = packed[r3 * n + n2];
    output[2 * (r2 * n + n2) + 1] = -packed[(r3 + n2) * n + n2];
    for (int c = 1; c < AOMMIN(4, n2); ++c) {
      output[2 * (r2 * n + c)] =
          packed[r3 * n + c] + packed[(r3 + n2) * n + c + n2];
      output[2 * (r2 * n + c) + 1] =
          -packed[(r3 + n2) * n + c] + packed[r3 * n + c + n2];
    }
    for (int c = 4; c < n2; c += 4) {
      __m128 real1 = _mm_load_ps(packed + r3 * n + c);
      __m128 real2 = _mm_load_ps(packed + (r3 + n2) * n + c + n2);
      __m128 imag1 = _mm_load_ps(packed + (r3 + n2) * n + c);
      __m128 imag2 = _mm_load_ps(packed + r3 * n + c + n2);
      real1 = _mm_add_ps(real1, real2);
      imag1 = _mm_sub_ps(imag2, imag1);
      _mm_store_ps(output + 2 * (r2 * n + c), _mm_unpacklo_ps(real1, imag1));
      _mm_store_ps(output + 2 * (r2 * n + c + 2),
                   _mm_unpackhi_ps(real1, imag1));
    }
  }
}